

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
(anonymous_namespace)::roundtrip<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,_anonymous_namespace_ *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in)

{
  Result *in_R9;
  ExpressionDecomposer local_1e4;
  unsigned_long local_1e0;
  Expression_lhs<unsigned_long> local_1d8;
  Result local_1c8;
  OutputStream ostream;
  stringstream stream;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ios::exceptions((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  ostream.stream = &stream;
  mserialize::detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<OutputStream>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,&ostream);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  local_1d8.lhs = std::ostream::tellp();
  local_1d8.m_at = local_1e4.m_at;
  local_1e0 = *(long *)(this + 8) + 4;
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_1c8,&local_1d8,&local_1e0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18c19c,(char *)0x36,0x18c3cc,&local_1c8.m_passed,in_R9);
  doctest::String::~String(&local_1c8.m_decomp);
  local_1d8.lhs = (unsigned_long)&stream;
  mserialize::detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<InputStream>(__return_storage_ptr__,(InputStream *)&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}